

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O3

void __thiscall jessilib::timer::timer(timer *this,duration_t in_period,function_t *in_callback)

{
  multiset<jessilib::impl::timer_context_*,_jessilib::impl::timer_manager::timer_sort,_std::allocator<jessilib::impl::timer_context_*>_>
  *this_00;
  _Manager_type p_Var1;
  bool bVar2;
  int iVar3;
  timer_context *this_01;
  timer_manager *ptVar4;
  logic_error *this_02;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar5;
  _Alloc_node __an;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type local_40;
  element_type *local_38;
  _Alloc_node local_30;
  
  this_01 = (timer_context *)operator_new(0x88);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (_Manager_type)0x0;
  local_40 = in_callback->_M_invoker;
  p_Var1 = (in_callback->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_58._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(in_callback->super__Function_base)._M_functor;
    local_58._8_8_ = *(undefined8 *)((long)&(in_callback->super__Function_base)._M_functor + 8);
    (in_callback->super__Function_base)._M_manager = (_Manager_type)0x0;
    in_callback->_M_invoker = (_Invoker_type)0x0;
    local_48 = p_Var1;
  }
  impl::timer_context::timer_context(this_01,(duration_t)in_period.__r,(function_t *)&local_58);
  std::__shared_ptr<jessilib::impl::timer_context,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<jessilib::impl::timer_context,void>
            ((__shared_ptr<jessilib::impl::timer_context,(__gnu_cxx::_Lock_policy)2> *)this,this_01)
  ;
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (in_period.__r == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Failed assertion: \'in_period.count() != 0\' at /workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/common/timer/timer.cpp:85"
               ,0xb3);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    this_02 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_02,
               "Failed assertion: \'in_period.count() != 0\' at /workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/common/timer/timer.cpp:85"
              );
  }
  else {
    bVar2 = impl::timer_context::null
                      ((this->m_context).
                       super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (!bVar2) {
      ptVar4 = impl::timer_manager::instance();
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)&ptVar4->m_mutex);
      if (iVar3 == 0) {
        this_00 = &ptVar4->m_active_timers;
        local_38 = (this->m_context).
                   super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
        pVar5 = std::
                _Rb_tree<jessilib::impl::timer_context_*,_jessilib::impl::timer_context_*,_std::_Identity<jessilib::impl::timer_context_*>,_jessilib::impl::timer_manager::timer_sort,_std::allocator<jessilib::impl::timer_context_*>_>
                ::_M_get_insert_equal_pos(&this_00->_M_t,&local_38);
        local_30._M_t = &this_00->_M_t;
        std::
        _Rb_tree<jessilib::impl::timer_context*,jessilib::impl::timer_context*,std::_Identity<jessilib::impl::timer_context*>,jessilib::impl::timer_manager::timer_sort,std::allocator<jessilib::impl::timer_context*>>
        ::
        _M_insert_<jessilib::impl::timer_context*,std::_Rb_tree<jessilib::impl::timer_context*,jessilib::impl::timer_context*,std::_Identity<jessilib::impl::timer_context*>,jessilib::impl::timer_manager::timer_sort,std::allocator<jessilib::impl::timer_context*>>::_Alloc_node>
                  ((_Rb_tree<jessilib::impl::timer_context*,jessilib::impl::timer_context*,std::_Identity<jessilib::impl::timer_context*>,jessilib::impl::timer_manager::timer_sort,std::allocator<jessilib::impl::timer_context*>>
                    *)this_00,pVar5.first,pVar5.second,&local_38,&local_30);
        pthread_mutex_unlock((pthread_mutex_t *)&ptVar4->m_mutex);
        std::condition_variable::notify_one();
        return;
      }
      std::__throw_system_error(iVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Failed assertion: \'!m_context->null()\' at /workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/common/timer/timer.cpp:86"
               ,0xaf);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    this_02 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_02,
               "Failed assertion: \'!m_context->null()\' at /workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/common/timer/timer.cpp:86"
              );
  }
  *(undefined ***)this_02 = &PTR__logic_error_001b2dc8;
  __cxa_throw(this_02,&assertion_failed::typeinfo,std::logic_error::~logic_error);
}

Assistant:

timer::timer(duration_t in_period, function_t in_callback)
	: m_context{ new impl::timer_context{ in_period, std::move(in_callback) } } {
	// Add timer_context to timer_manager
	// Note: this logic must be here (rather than timer_context) to ensure timer_context is wrapped in a shared_ptr
	if (jessilib_debug_assert(in_period.count() != 0)
		&& jessilib_debug_assert(!m_context->null())) {
		// Add timer
		impl::timer_manager& manager = impl::timer_manager::instance();
		{
			std::lock_guard<std::mutex> lock(manager.m_mutex);
			manager.m_active_timers.insert(m_context.get());
		}

		// Notify
		manager.m_cvar.notify_one();
	}
}